

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelside.cpp
# Opt level: O2

void __thiscall TPZGeoElSide::RemoveConnectivity(TPZGeoElSide *this)

{
  int iVar1;
  int iVar2;
  TPZGeoElSide neighpre;
  TPZGeoElSide neigh;
  TPZGeoElSide neighpos;
  TPZGeoElSide local_98;
  _func_int **local_80;
  TPZGeoElSide local_78;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  iVar1 = this->fSide;
  if (-1 < iVar1 && this->fGeoEl != (TPZGeoEl *)0x0) {
    iVar2 = (**(code **)(*(long *)this->fGeoEl + 0xf0))();
    if (iVar2 <= iVar1) {
      std::operator<<((ostream *)&std::cerr,"TPZGeoElSide::RemoveConnectivity Index out of bound\n")
      ;
    }
    local_98.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    local_98.fGeoEl = (TPZGeoEl *)0x0;
    local_98.fSide = -1;
    Neighbour(&local_78,this);
    if ((local_78.fGeoEl == (TPZGeoEl *)0x0) || (local_78.fSide == -1)) {
      std::operator<<((ostream *)&std::cerr,
                      "TPZGeoElSide::RemoveConnectivity trying to remove null or inexistent connection"
                     );
    }
    local_80 = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    local_60.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
    local_60.fGeoEl = local_78.fGeoEl;
    local_60.fSide = local_78.fSide;
    while( true ) {
      if (((local_78.fGeoEl == (TPZGeoEl *)0x0) || (local_78.fSide < 0)) ||
         (local_78.fGeoEl == this->fGeoEl && local_78.fSide == this->fSide)) break;
      local_98.fSide = local_78.fSide;
      local_98.fGeoEl = local_78.fGeoEl;
      Neighbour(&local_48,&local_78);
      local_78.fSide = local_48.fSide;
      local_78.fGeoEl = local_48.fGeoEl;
    }
    if (local_78.fSide == this->fSide && local_78.fGeoEl == this->fGeoEl) {
      local_48.super_TPZSavable._vptr_TPZSavable = local_80;
      local_48.fGeoEl = (TPZGeoEl *)0x0;
      local_48.fSide = -1;
      SetNeighbour(this,&local_48);
      if ((local_98.fGeoEl != (TPZGeoEl *)0x0) && (-1 < local_98.fSide)) {
        SetNeighbour(&local_98,&local_60);
      }
    }
    else {
      std::operator<<((ostream *)&std::cerr,
                      "TPZGeoElSide::RemoveConnectivity neighbourhood cycle error");
    }
  }
  return;
}

Assistant:

void TPZGeoElSide::RemoveConnectivity(){
	
	if(!Exists()) return;
	if(fSide < 0 || fSide >= fGeoEl->NSides()) {
		PZError << "TPZGeoElSide::RemoveConnectivity Index out of bound\n";
	}
	//it removes the connectivity of the cycle where this inserted one: 
	//neighpre->this->neighpos => neighpre->neighpos
	TPZGeoElSide neighpre,neigh = Neighbour();
	if(neigh.Element() == NULL || neigh.Side() == -1){
		PZError << "TPZGeoElSide::RemoveConnectivity trying to remove null or inexistent connection";
	}
	TPZGeoElSide neighpos = neigh;
	while(neigh.Exists() && neigh != *this){
		neighpre = neigh;
		neigh = neigh.Neighbour();
	}
	if(neigh == *this){
		this->SetNeighbour(TPZGeoElSide());
		if (neighpre.Exists()) neighpre.SetNeighbour(neighpos);
	} else {
		PZError << "TPZGeoElSide::RemoveConnectivity neighbourhood cycle error";
	}
}